

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit.hpp
# Opt level: O3

test_case *
boost::unit_test::make_test_case
          (function<void_()> *test_func,const_string *tc_name,const_string *tc_file,size_t tc_line)

{
  test_case *this;
  const_string *name;
  string local_78;
  const_string local_58;
  iterator local_48;
  iterator pvStack_40;
  const_string local_38;
  
  this = (test_case *)operator_new(0x138);
  local_48 = tc_name->m_begin;
  pvStack_40 = tc_name->m_end;
  ut_detail::normalize_test_case_name_abi_cxx11_(&local_78,(ut_detail *)&local_48,name);
  local_38.m_begin = local_78._M_dataplus._M_p;
  local_38.m_end = local_78._M_dataplus._M_p + local_78._M_string_length;
  local_58.m_begin = tc_file->m_begin;
  local_58.m_end = tc_file->m_end;
  test_case::test_case(this,&local_38,&local_58,tc_line,test_func);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

inline test_case*
make_test_case( boost::function<void ()> const& test_func, const_string tc_name, const_string tc_file, std::size_t tc_line )
{
    return new test_case( ut_detail::normalize_test_case_name( tc_name ), tc_file, tc_line, test_func );
}